

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexPacket.cpp
# Opt level: O2

VertexPacket * __thiscall rr::VertexPacketAllocator::alloc(VertexPacketAllocator *this)

{
  VertexPacket *pVVar1;
  pointer ppVVar2;
  _Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> local_30;
  
  ppVVar2 = (this->m_singleAllocPool).
            super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((this->m_singleAllocPool).
      super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
      super__Vector_impl_data._M_start == ppVVar2) {
    allocArray((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)&local_30,this,8);
    std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::_M_move_assign
              (&this->m_singleAllocPool,&local_30);
    std::_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::~_Vector_base
              (&local_30);
    ppVVar2 = (this->m_singleAllocPool).
              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  pVVar1 = ppVVar2[-1];
  (this->m_singleAllocPool).
  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppVVar2 + -1;
  return pVVar1;
}

Assistant:

VertexPacket* VertexPacketAllocator::alloc (void)
{
	const size_t poolSize = 8;

	if (m_singleAllocPool.empty())
		m_singleAllocPool = allocArray(poolSize);

	VertexPacket* packet = *--m_singleAllocPool.end();
	m_singleAllocPool.pop_back();
	return packet;
}